

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O2

int CMtrace_init(CManager cm,CMTraceType trace_type)

{
  int j;
  char *pcVar1;
  long lVar2;
  FILE *__s;
  uint uVar3;
  char name [40];
  
  CMtrace_val[0] = 0;
  CMtrace_val[0xb] = 1;
  pcVar1 = getenv("CMControlVerbose");
  CMtrace_val[1] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMConnectionVerbose");
  CMtrace_val[2] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMDataVerbose");
  CMtrace_val[4] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTransportVerbose");
  CMtrace_val[5] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMFormatVerbose");
  CMtrace_val[6] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMFreeVerbose");
  CMtrace_val[7] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMAttrVerbose");
  CMtrace_val[8] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMBufferVerbose");
  CMtrace_val[9] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("EVerbose");
  CMtrace_val[10] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMSelectVerbose");
  CMtrace_val[0xc] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("EVdfgVerbose");
  CMtrace_val[0xd] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTraceTiming");
  CMtrace_timing = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTracePID");
  CMtrace_PID = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("EVWarning");
  if (pcVar1 != (char *)0x0) {
    __isoc99_sscanf(pcVar1,"%d",0x16a30c);
  }
  pcVar1 = getenv("CMVerbose");
  if (pcVar1 != (char *)0x0) {
    for (lVar2 = 0; lVar2 != 0xe; lVar2 = lVar2 + 1) {
      CMtrace_val[lVar2] = 1;
    }
  }
  pcVar1 = getenv("CMLowLevelVerbose");
  CMtrace_val[3] = (int)(pcVar1 != (char *)0x0);
  pcVar1 = getenv("CMTraceFile");
  if (pcVar1 != (char *)0x0) {
    CMTrace_file_num = getpid();
  }
  if (CMTrace_file_num != -1) {
    if (CMtrace_init::cm_count == 0) {
      sprintf(name,"CMTrace_output.%d",(ulong)(uint)CMTrace_file_num);
    }
    else {
      sprintf(name,"CMTrace_output.%d_%d",(ulong)(uint)CMTrace_file_num);
    }
    CMtrace_init::cm_count = CMtrace_init::cm_count + 1;
    __s = fopen(name,"w");
    cm->CMTrace_file = (FILE *)__s;
    if (__s != (FILE *)0x0) {
      fwrite("Trace flags set : \n",0x13,1,__s);
      if (CMtrace_val[0] != 0) {
        fwrite("CMAlwaysTrace, ",0xf,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[1] != 0) {
        fwrite("CMControlVerbose, ",0x12,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[2] != 0) {
        fwrite("CMConnectionVerbose, ",0x15,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[3] != 0) {
        fwrite("CMLowLevelVerbose, ",0x13,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[4] != 0) {
        fwrite("CMDataVerbose, ",0xf,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[5] != 0) {
        fwrite("CMTransportVerbose, ",0x14,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[6] != 0) {
        fwrite("CMFormatVerbose, ",0x11,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[7] != 0) {
        fwrite("CMFreeVerbose, ",0xf,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[8] != 0) {
        fwrite("CMAttrVerbose, ",0xf,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[9] != 0) {
        fwrite("CMBufferVerbose, ",0x11,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[10] != 0) {
        fwrite("EVerbose, ",10,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[0xb] != 0) {
        fwrite("EVWarning, ",0xb,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[0xc] != 0) {
        fwrite("CMSelectVerbose, ",0x11,1,(FILE *)cm->CMTrace_file);
      }
      if (CMtrace_val[0xd] != 0) {
        fwrite("EVdfgVerbose, ",0xe,1,(FILE *)cm->CMTrace_file);
      }
      fputc(10,(FILE *)cm->CMTrace_file);
      goto LAB_001221b6;
    }
    printf("Failed to open trace file %s\n",name);
  }
  cm->CMTrace_file = _stdout;
LAB_001221b6:
  lVar2 = 0;
  uVar3 = 0;
  do {
    if (lVar2 != 0xb) {
      if (lVar2 == 0xe) {
        if (CMtrace_val[5] != 0) {
          CMset_dlopen_verbose(1);
        }
        if (uVar3 != 0) {
          EVfprint_version(cm->CMTrace_file);
        }
        fflush((FILE *)cm->CMTrace_file);
        return CMtrace_val[trace_type];
      }
      uVar3 = uVar3 | CMtrace_val[lVar2];
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

extern int CMtrace_init(CManager cm, CMTraceType trace_type)
{
    int i, trace = 0;
    char *str;
    CMtrace_val[0] = 0;
    CMtrace_val[EVWarning] = 1;  /* default on */
    CMtrace_val[CMControlVerbose] = (getenv("CMControlVerbose") != NULL);
    CMtrace_val[CMConnectionVerbose] = (getenv("CMConnectionVerbose") != NULL);
    CMtrace_val[CMDataVerbose] = (getenv("CMDataVerbose") != NULL);
    CMtrace_val[CMTransportVerbose] = (getenv("CMTransportVerbose") != NULL);
    CMtrace_val[CMFormatVerbose] = (getenv("CMFormatVerbose") != NULL);
    CMtrace_val[CMFreeVerbose] = (getenv("CMFreeVerbose") != NULL);
    CMtrace_val[CMAttrVerbose] = (getenv("CMAttrVerbose") != NULL);
    CMtrace_val[CMBufferVerbose] = (getenv("CMBufferVerbose") != NULL);
    CMtrace_val[EVerbose] = (getenv("EVerbose") != NULL);
    CMtrace_val[CMSelectVerbose] = (getenv("CMSelectVerbose") != NULL);    
    CMtrace_val[EVdfgVerbose] = (getenv("EVdfgVerbose") != NULL);
    CMtrace_timing = (getenv("CMTraceTiming") != NULL);
    CMtrace_PID = (getenv("CMTracePID") != NULL);
    if ((str = getenv("EVWarning")) != NULL) {
	sscanf(str, "%d", &CMtrace_val[EVWarning]);
    }
    if (getenv("CMVerbose") != NULL) {
	int j;
	for (j=0; j<CMLastTraceType; j++)
	    CMtrace_val[j] = 1;
    }
    /* for low level verbose, value overrides general CMVerbose */
    CMtrace_val[CMLowLevelVerbose] = (getenv("CMLowLevelVerbose") != NULL);

    if (getenv("CMTraceFile") != NULL) {
	CMTrace_file_num = getpid();
    }
    if (CMTrace_file_num != -1) {
	char name[40];
	static int cm_count = 0;
	if (cm_count == 0) {
	    sprintf(name, "CMTrace_output.%d", (int)CMTrace_file_num);
	} else {
	    sprintf(name, "CMTrace_output.%d_%d", (int)CMTrace_file_num, cm_count);
	}
	cm_count++;
	cm->CMTrace_file = fopen(name, "w");
	if (cm->CMTrace_file == NULL) {
	    printf("Failed to open trace file %s\n", name);
	    cm->CMTrace_file = stdout;
	} else {
	    fprintf(cm->CMTrace_file, "Trace flags set : \n");
	    if (CMtrace_val[CMAlwaysTrace]) fprintf(cm->CMTrace_file, "CMAlwaysTrace, ");
	    if (CMtrace_val[CMControlVerbose]) fprintf(cm->CMTrace_file, "CMControlVerbose, ");
	    if (CMtrace_val[CMConnectionVerbose]) fprintf(cm->CMTrace_file, "CMConnectionVerbose, ");
	    if (CMtrace_val[CMLowLevelVerbose]) fprintf(cm->CMTrace_file, "CMLowLevelVerbose, ");
	    if (CMtrace_val[CMDataVerbose]) fprintf(cm->CMTrace_file, "CMDataVerbose, ");
	    if (CMtrace_val[CMTransportVerbose]) fprintf(cm->CMTrace_file, "CMTransportVerbose, ");
	    if (CMtrace_val[CMFormatVerbose]) fprintf(cm->CMTrace_file, "CMFormatVerbose, ");
	    if (CMtrace_val[CMFreeVerbose]) fprintf(cm->CMTrace_file, "CMFreeVerbose, ");
	    if (CMtrace_val[CMAttrVerbose]) fprintf(cm->CMTrace_file, "CMAttrVerbose, ");
	    if (CMtrace_val[CMBufferVerbose]) fprintf(cm->CMTrace_file, "CMBufferVerbose, ");
	    if (CMtrace_val[EVerbose]) fprintf(cm->CMTrace_file, "EVerbose, ");
	    if (CMtrace_val[EVWarning]) fprintf(cm->CMTrace_file, "EVWarning, ");
	    if (CMtrace_val[CMSelectVerbose]) fprintf(cm->CMTrace_file, "CMSelectVerbose, ");
	    if (CMtrace_val[EVdfgVerbose]) fprintf(cm->CMTrace_file, "EVdfgVerbose, ");
	    fprintf(cm->CMTrace_file, "\n");
	}
    } else {
	cm->CMTrace_file = stdout;
    }
    for (i = 0; i < sizeof(CMtrace_val)/sizeof(CMtrace_val[0]); i++) {
	if (i!=EVWarning) trace |= CMtrace_val[i];
    }
    if (CMtrace_val[CMTransportVerbose]) {
	CMset_dlopen_verbose(1);
    }

    if (trace != 0) {
	EVfprint_version(cm->CMTrace_file);
    }
    fflush(cm->CMTrace_file);
    return CMtrace_val[trace_type];
}